

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::Variable
          (Variable *this,string *name_,VarType *type,bool isArray)

{
  pointer pcVar1;
  
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__Variable_021a7310;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name_->_M_string_length);
  glu::VarType::VarType(&this->m_type,type);
  this->m_isArray = isArray;
  return;
}

Assistant:

Variable (const string& name_, const glu::VarType& type, bool isArray)
			: m_name		(name_)
			, m_type		(type)
			, m_isArray		(isArray)
		{
			DE_ASSERT(!type.isArrayType());
		}